

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O1

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  uint64_t uVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  bVar2 = -(char)Mp->e;
  uVar10 = 1L << (bVar2 & 0x3f);
  uVar9 = Mp->f;
  uVar12 = uVar9 >> (bVar2 & 0x3f);
  uVar1 = W->f;
  uVar5 = 1;
  uVar11 = (uint)uVar12;
  if (((((9 < uVar11) && (uVar5 = 2, 99 < uVar11)) && (uVar5 = 3, 999 < uVar11)) &&
      ((uVar5 = 4, 9999 < uVar11 && (uVar5 = 5, 99999 < uVar11)))) &&
     ((uVar5 = 6, 999999 < uVar11 && (uVar5 = 7, 9999999 < uVar11)))) {
    uVar5 = 9 - (uVar11 < 100000000);
  }
  uVar7 = uVar9 - uVar1;
  uVar8 = uVar10 - 1 & uVar9;
  *len = 0;
  do {
    iVar6 = (int)uVar12;
    switch(uVar5) {
    case 0:
      iVar6 = -uVar5;
      do {
        uVar9 = delta;
        cVar3 = (char)(uVar8 * 10 >> (bVar2 & 0x3f));
        if ((cVar3 != '\0') || (*len != 0)) {
          iVar4 = *len;
          *len = iVar4 + 1;
          buffer[iVar4] = cVar3 + '0';
        }
        delta = uVar9 * 10;
        uVar8 = uVar8 * 10 & uVar10 - 1;
        iVar6 = iVar6 + 1;
      } while (delta < uVar8 || delta - uVar8 == 0);
      *K = *K - iVar6;
      if (iVar6 < 9) {
        uVar12 = (ulong)DigitGen::kPow10[iVar6];
      }
      else {
        uVar12 = 0;
      }
      if (uVar10 <= delta - uVar8) {
        uVar12 = uVar12 * uVar7;
        uVar7 = uVar12 - uVar8;
        if (uVar12 < uVar8 || uVar7 == 0) {
          return;
        }
        iVar6 = *len;
        uVar8 = uVar8 + uVar10;
        uVar9 = uVar9 * 10 - uVar8;
        do {
          if ((uVar12 <= uVar8) && (uVar7 <= uVar8 - uVar12)) {
            return;
          }
          buffer[(long)iVar6 + -1] = buffer[(long)iVar6 + -1] + -1;
          bVar15 = uVar10 <= uVar9;
          uVar9 = uVar9 - uVar10;
          if (uVar12 <= uVar8) {
            return;
          }
          uVar7 = uVar7 - uVar10;
          uVar8 = uVar8 + uVar10;
        } while (bVar15);
        return;
      }
      return;
    case 1:
      uVar12 = 0;
      goto LAB_0048157b;
    case 2:
      iVar13 = (int)((uVar12 & 0xffffffff) / 10);
      iVar4 = (int)((uVar12 & 0xffffffff) / 10) * 10;
      break;
    case 3:
      iVar13 = (int)((uVar12 & 0xffffffff) / 100);
      iVar4 = (int)((uVar12 & 0xffffffff) / 100) * 100;
      break;
    case 4:
      iVar13 = (int)((uVar12 & 0xffffffff) / 1000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 1000) * 1000;
      break;
    case 5:
      iVar13 = (int)((uVar12 & 0xffffffff) / 10000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 10000) * 10000;
      break;
    case 6:
      uVar12 = uVar12 >> 5 & 0x7ffffff;
      iVar13 = (int)(uVar12 / 0xc35);
      iVar4 = (int)(uVar12 / 0xc35) * 100000;
      break;
    case 7:
      iVar13 = (int)((uVar12 & 0xffffffff) / 1000000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 8:
      iVar13 = (int)((uVar12 & 0xffffffff) / 10000000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 9:
      iVar13 = (int)((uVar12 & 0xffffffff) / 100000000);
      iVar4 = (int)((uVar12 & 0xffffffff) / 100000000) * 100000000;
      break;
    default:
      iVar6 = 0;
      goto LAB_0048157b;
    }
    uVar12 = (ulong)(uint)(iVar6 - iVar4);
    iVar6 = iVar13;
LAB_0048157b:
    if ((iVar6 != 0) || (*len != 0)) {
      iVar4 = *len;
      *len = iVar4 + 1;
      buffer[iVar4] = (char)iVar6 + '0';
    }
    uVar5 = uVar5 - 1;
    uVar14 = ((uVar12 & 0xffffffff) << (bVar2 & 0x3f)) + uVar8;
    if (uVar14 <= delta) {
      *K = *K + uVar5;
      uVar10 = (ulong)DigitGen::kPow10[uVar5] << (bVar2 & 0x3f);
      if ((uVar14 < uVar7) && (uVar10 <= delta - uVar14)) {
        iVar6 = *len;
        uVar12 = uVar7 - uVar14;
        uVar14 = uVar14 + uVar10;
        uVar8 = delta - uVar14;
        do {
          if ((uVar7 <= uVar14) && (uVar12 <= (uVar1 - uVar9) + uVar14)) {
            return;
          }
          buffer[(long)iVar6 + -1] = buffer[(long)iVar6 + -1] + -1;
          bVar15 = uVar10 <= uVar8;
          uVar8 = uVar8 - uVar10;
          if (uVar7 <= uVar14) {
            return;
          }
          uVar12 = uVar12 - uVar10;
          uVar14 = uVar14 + uVar10;
        } while (bVar15);
      }
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    unsigned kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -static_cast<int>(kappa);
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 9 ? kPow10[-static_cast<int>(kappa)] : 0));
            return;
        }
    }
}